

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void dumb_it_sr_get_channel_state(DUMB_IT_SIGRENDERER *sr,int channel,DUMB_IT_CHANNEL_STATE *state)

{
  ushort uVar1;
  int iVar2;
  IT_PLAYING *playing;
  float fVar3;
  int t;
  double delta;
  uint local_34;
  double local_30;
  
  if (sr != (DUMB_IT_SIGRENDERER *)0x0) {
    if (channel < 0x40) {
      playing = sr->channel[channel].playing;
    }
    else {
      playing = sr->playing[channel - 0x40];
    }
    if ((playing != (IT_PLAYING *)0x0) && ((playing->flags & 8) == 0)) {
      state->channel =
           (int)((ulong)((long)playing->channel + (-0x20 - (long)sr)) >> 5) * -0x33333333;
      state->sample = (uint)playing->sampnum;
      fVar3 = calculate_volume(sr,playing,1.0);
      state->volume = fVar3;
      iVar2 = apply_pan_envelope(playing);
      state->pan = (uchar)((uint)(iVar2 + 0x80) >> 8);
      state->subpan = (char)iVar2;
      local_30 = (double)(playing->delta * 65536.0);
      local_34 = (uint)playing->filter_cutoff << 8;
      apply_pitch_modifications(sr->sigdata,playing,&local_30,(int *)&local_34);
      state->freq = (int)local_30;
      if ((local_34 == 0x7f00) && (playing->filter_resonance == '\0')) {
        state->filter_resonance = playing->true_filter_resonance;
        local_34 = (uint)playing->true_filter_cutoff;
      }
      else {
        state->filter_resonance = playing->filter_resonance;
      }
      uVar1 = (ushort)local_34 << 8 | (ushort)local_34 >> 8;
      state->filter_cutoff = (char)uVar1;
      state->filter_subcutoff = (char)(uVar1 >> 8);
      return;
    }
  }
  state->sample = 0;
  return;
}

Assistant:

void DUMBEXPORT dumb_it_sr_get_channel_state(DUMB_IT_SIGRENDERER *sr, int channel, DUMB_IT_CHANNEL_STATE *state)
{
	IT_PLAYING *playing;
	int t; /* temporary var for holding accurate pan and filter cutoff */
	double delta;
	ASSERT(channel < DUMB_IT_TOTAL_CHANNELS);
	if (!sr) { state->sample = 0; return; }
	if (channel >= DUMB_IT_N_CHANNELS) {
		playing = sr->playing[channel - DUMB_IT_N_CHANNELS];
		if (!playing) { state->sample = 0; return; }
	} else {
		playing = sr->channel[channel].playing;
		if (!playing) { state->sample = 0; return; }
	}

	if (playing->flags & IT_PLAYING_DEAD) { state->sample = 0; return; }

	state->channel = (int)(playing->channel - sr->channel);
	state->sample = playing->sampnum;
	state->volume = calculate_volume(sr, playing, 1.0f);

	t = apply_pan_envelope(playing);
	state->pan = (unsigned char)((t + 128) >> IT_ENVELOPE_SHIFT);
	state->subpan = (signed char)t;

	delta = playing->delta * 65536.0f;
	t = playing->filter_cutoff << IT_ENVELOPE_SHIFT;
	apply_pitch_modifications(sr->sigdata, playing, &delta, &t);
	state->freq = (int)delta;
	if (t == 127 << IT_ENVELOPE_SHIFT && playing->filter_resonance == 0) {
		state->filter_resonance = playing->true_filter_resonance;
		t = playing->true_filter_cutoff;
	} else
		state->filter_resonance = playing->filter_resonance;
	state->filter_cutoff = (unsigned char)(t >> 8);
	state->filter_subcutoff = (unsigned char)t;
}